

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O3

void __thiscall Jinx::Variant::Read(Variant *this,BinaryReader *reader)

{
  size_t *pos;
  ValueType VVar1;
  ulong in_RAX;
  uint8_t vt;
  uint8_t t;
  uint8_t b;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  Destroy(this);
  pos = &reader->m_pos;
  Buffer::Read<unsigned_char*>
            ((reader->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pos,(uchar *)((long)&uStack_28 + 6));
  VVar1 = Impl::ByteToValueType(uStack_28._6_1_);
  this->m_type = VVar1;
  switch(VVar1) {
  case Null:
  case Collection:
  case CollectionItr:
  case Coroutine:
  case UserObject:
    break;
  case Number:
    Buffer::Read<double*>
              ((reader->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,pos,&(this->field_1).m_number);
    break;
  case Integer:
    Buffer::Read<long*>((reader->m_buffer).
                        super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,pos,
                        &(this->field_1).m_integer);
    break;
  case Boolean:
    uStack_28 = uStack_28 & 0xffffffffffffff;
    Buffer::Read<unsigned_char*>
              ((reader->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,pos,(uchar *)((long)&uStack_28 + 7));
    (this->field_1).m_boolean = uStack_28._7_1_ != '\0';
    break;
  case String:
    (this->field_1).m_collection.
    super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)((long)&this->field_1 + 0x10);
    (this->field_1).m_string._M_string_length = 0;
    *(undefined1 *)((long)&this->field_1 + 0x10) = 0;
    Impl::BinaryReader::Read(reader,&(this->field_1).m_string);
    break;
  case Function:
    Buffer::Read<unsigned_long*>
              ((reader->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,pos,(unsigned_long *)&(this->field_1).m_valType);
    break;
  case Buffer:
    (this->field_1).m_number = 0.0;
    (this->field_1).m_string._M_string_length = 0;
    Impl::BinaryReader::Read(reader,&(this->field_1).m_buffer);
    break;
  case Guid:
    Buffer::Read((reader->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pos,&this->field_1,0x10);
    break;
  case ValType:
    Buffer::Read<unsigned_char*>
              ((reader->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,pos,(uchar *)((long)&uStack_28 + 5));
    VVar1 = Impl::ByteToValueType(uStack_28._5_1_);
    (this->field_1).m_valType = VVar1;
    break;
  default:
    __assert_fail("!\"Unknown variant type!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxVariant.cpp"
                  ,0x330,"void Jinx::Variant::Read(Impl::BinaryReader &)");
  }
  return;
}

Assistant:

inline_t void Variant::Read(Impl::BinaryReader & reader)
	{
		Destroy();
		uint8_t t;
		reader.Read(&t);
		m_type = Impl::ByteToValueType(t);

		switch (m_type)
		{
			case ValueType::Null:
				break;
			case ValueType::Number:
				reader.Read(&m_number);
				break;
			case ValueType::Integer:
				reader.Read(&m_integer);
				break;
			case ValueType::Boolean:
				reader.Read(&m_boolean);
				break;
			case ValueType::String:
				new(&m_string) String();
				reader.Read(&m_string);
				break;
			case ValueType::Collection:
				break;
			case ValueType::CollectionItr:
				break;
			case ValueType::Function:
				reader.Read(&m_function);
				break;
			case ValueType::Coroutine:
				break;
			case ValueType::UserObject:
				break;
			case ValueType::Buffer:
				new(&m_buffer) BufferPtr();
				reader.Read(m_buffer);
				break;
			case ValueType::Guid:
				reader.Read(&m_guid, sizeof(m_guid));
				break;
			case ValueType::ValType:
			{
				uint8_t vt;
				reader.Read(&vt);
				m_valType = Impl::ByteToValueType(vt);
				break;
			}
			default:
				assert(!"Unknown variant type!");
		};

	}